

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void PPrintAttrValue(TidyDocImpl *doc,uint indent,ctmbstr value,uint delim,Bool wrappable,
                    Bool scriptAttr)

{
  TidyIndent *pTVar1;
  uint *puVar2;
  int iVar3;
  char cVar4;
  int spaces;
  int iVar5;
  int iVar6;
  uint uVar7;
  Bool BVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  TidyPrintImpl *pprint;
  uint c_00;
  bool bVar12;
  bool bVar13;
  uint c;
  ctmbstr entity;
  uint local_54;
  TidyPrintImpl *local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  char *local_38;
  
  local_50 = &doc->pprint;
  iVar3 = *(int *)((doc->config).value + 0x5f);
  local_44 = (wrappable == no) + 4;
  if (((value != (ctmbstr)0x0) && (*value == '<')) &&
     ((value[1] == '%' ||
      ((value[1] == '@' || (iVar5 = prvTidytmbstrncmp(value,"<?php",5), iVar5 == 0)))))) {
    local_44 = local_44 | 0x10;
  }
  c_00 = 0x22;
  if (delim != 0) {
    c_00 = delim;
  }
  AddChar(local_50,0x3d);
  if ((*(int *)((doc->config).value + 100) == 0) || (*(int *)((doc->config).value + 0x62) != 0)) {
    uVar10 = (doc->pprint).linelen;
    if ((ulong)(indent + uVar10) < (doc->config).value[0x5d].v) {
      if ((doc->pprint).indent[0].spaces < 0) {
        (doc->pprint).indent[0].spaces = indent;
      }
      (doc->pprint).wraphere = uVar10;
    }
    else if ((doc->pprint).ixInd == 0) {
      (doc->pprint).indent[1].spaces = indent;
      (doc->pprint).ixInd = 1;
    }
    CheckWrapIndent(doc,indent);
  }
  AddChar(local_50,c_00);
  if (value != (ctmbstr)0x0) {
    local_3c = *(uint *)((doc->config).value + 0x5d);
    pTVar1 = (doc->pprint).indent;
    uVar11 = (ulong)(doc->pprint).ixInd;
    local_40 = (doc->pprint).linelen;
    (doc->pprint).indent[uVar11].attrValStart = local_40;
    (doc->pprint).indent[uVar11].attrStringStart = -1;
    cVar4 = *value;
    if (cVar4 != '\0') {
      bVar12 = c_00 == 0x22;
      local_38 = "&#39;";
      if (bVar12) {
        local_38 = "&quot;";
      }
      uVar10 = 0xffffffff;
      pprint = local_50;
      do {
        local_54 = (uint)cVar4;
        if ((wrappable == no) || (cVar4 != ' ')) {
          if (wrappable != no) goto LAB_0014f06f;
        }
        else {
          uVar9 = (doc->pprint).linelen;
          if ((ulong)(indent + uVar9) < (doc->config).value[0x5d].v) {
            if (pTVar1->spaces < 0) {
              pTVar1->spaces = indent;
            }
            (doc->pprint).wraphere = uVar9;
            uVar7 = (doc->pprint).ixInd;
          }
          else {
            uVar7 = (doc->pprint).ixInd;
            if (uVar7 == 0) {
              (doc->pprint).indent[1].spaces = indent;
              (doc->pprint).ixInd = 1;
              uVar9 = (doc->pprint).wraphere;
              iVar5 = (doc->pprint).indent[0].attrStringStart;
              iVar6 = iVar5 - uVar9;
              if (iVar6 != 0 && (int)uVar9 <= iVar5) {
                (doc->pprint).indent[1].attrStringStart = iVar6;
                (doc->pprint).indent[0].attrStringStart = -1;
              }
              iVar5 = (doc->pprint).indent[0].attrValStart;
              uVar7 = 1;
              iVar6 = iVar5 - uVar9;
              if (iVar6 != 0 && (int)uVar9 <= iVar5) {
                (doc->pprint).indent[1].attrValStart = iVar6;
                (doc->pprint).indent[0].attrValStart = -1;
              }
            }
          }
          (doc->pprint).indent[uVar7].attrValStart = local_40;
          (doc->pprint).indent[uVar7].attrStringStart = uVar10;
LAB_0014f06f:
          if ((doc->pprint).wraphere != 0) {
            iVar5 = (doc->pprint).indent[0].spaces;
            if (iVar5 < 1) {
              iVar5 = 0;
            }
            if (local_3c <= iVar5 + (doc->pprint).linelen) {
              BVar8 = WantIndent(doc);
              if ((BVar8 == no) || (WriteIndentChar(doc), (doc->pprint).wraphere != 0)) {
                uVar11 = 0;
                do {
                  prvTidyWriteChar((doc->pprint).linebuf[uVar11],doc->docOut);
                  uVar11 = uVar11 + 1;
                  uVar7 = (doc->pprint).wraphere;
                  pprint = local_50;
                } while (uVar11 < uVar7);
              }
              else {
                uVar7 = 0;
              }
              iVar5 = (doc->pprint).indent[0].attrStringStart;
              uVar9 = 0x20;
              if (iVar5 < (int)uVar7) {
                uVar9 = 0x5c;
              }
              if (iVar5 < 1) {
                uVar9 = 0x20;
              }
              if (iVar5 == 0) {
                uVar9 = 0x5c;
              }
              prvTidyWriteChar(uVar9,doc->docOut);
              prvTidyWriteChar(10,doc->docOut);
              puVar2 = &(doc->pprint).line;
              *puVar2 = *puVar2 + 1;
              ResetLineAfterWrap(pprint);
            }
          }
        }
        if (local_54 == c_00) {
          AddString(pprint,local_38);
LAB_0014f253:
          value = value + 1;
        }
        else {
          if (local_54 == 0x27) {
            bVar13 = bVar12;
            if (*(int *)((doc->config).value + 0x46) == 0) {
              AddChar(pprint,0x27);
            }
            else {
              AddString(pprint,"&#39;");
            }
joined_r0x0014f224:
            if (bVar13 && (iVar3 != 0 && scriptAttr != no)) {
              uVar7 = (doc->pprint).ixInd;
              uVar10 = 0xffffffff;
              if ((doc->pprint).indent[uVar7].attrStringStart < 0) {
                uVar10 = (doc->pprint).linelen;
              }
              pTVar1[uVar7].attrStringStart = uVar10;
            }
            goto LAB_0014f253;
          }
          if (local_54 == 0x22) {
            bVar13 = c_00 == 0x27;
            if (*(int *)((doc->config).value + 0x46) == 0) {
              AddChar(pprint,0x22);
            }
            else {
              AddString(pprint,"&quot;");
            }
            goto joined_r0x0014f224;
          }
          if (0x7f < local_54) {
            uVar9 = prvTidyGetUTF8(value,&local_54);
            value = value + uVar9;
          }
          value = value + 1;
          if (local_54 == 10) {
            uVar9 = 0;
            if (((int)uVar10 < 0) && (uVar9 = 0, *(int *)((doc->config).value + 0x2c) == 0)) {
              uVar9 = indent;
            }
            prvTidyPFlushLine(doc,uVar9);
          }
          else {
            PPrintChar(doc,local_54,local_44);
          }
        }
        cVar4 = *value;
      } while (cVar4 != '\0');
      uVar11 = (ulong)(doc->pprint).ixInd;
    }
    pTVar1 = (doc->pprint).indent + uVar11;
    pTVar1->attrValStart = -1;
    pTVar1->attrStringStart = -1;
  }
  AddChar(local_50,c_00);
  return;
}

Assistant:

static void PPrintAttrValue( TidyDocImpl* doc, uint indent,
                             ctmbstr value, uint delim, Bool wrappable, Bool scriptAttr )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool scriptlets = cfgBool(doc, TidyWrapScriptlets);

    uint mode = PREFORMATTED | ATTRIBVALUE;
    if ( wrappable )
        mode = NORMAL | ATTRIBVALUE;

    /* look for ASP, Tango or PHP instructions for computed attribute value */
    if ( value && value[0] == '<' )
    {
        if ( value[1] == '%' || value[1] == '@'||
             TY_(tmbstrncmp)(value, "<?php", 5) == 0 )
            mode |= CDATA;
    }

    if ( delim == 0 )
        delim = '"';

    AddChar( pprint, '=' );

    /* don't wrap after "=" for xml documents */
    if ( !cfgBool(doc, TidyXmlOut) || cfgBool(doc, TidyXhtmlOut) )
    {
        SetWrap( doc, indent );
        CheckWrapIndent( doc, indent );
        /*
        if ( !SetWrap(doc, indent) )
            PCondFlushLine( doc, indent );
        */
    }

    AddChar( pprint, delim );

    if ( value )
    {
        uint wraplen = cfg( doc, TidyWrapLen );
        int attrStart = SetInAttrVal( pprint );
        int strStart = ClearInString( pprint );

        while (*value != '\0')
        {
            uint c = *value;

            if ( wrappable && c == ' ' )
                SetWrapAttr( doc, indent, attrStart, strStart );

            if ( wrappable && pprint->wraphere > 0 &&
                 GetSpaces(pprint) + pprint->linelen >= wraplen )
                WrapAttrVal( doc );

            if ( c == delim )
            {
                ctmbstr entity = (c == '"' ? "&quot;" : "&#39;");
                AddString( pprint, entity );
                ++value;
                continue;
            }
            else if (c == '"')
            {
                if ( cfgBool(doc, TidyQuoteMarks) )
                    AddString( pprint, "&quot;" );
                else
                    AddChar( pprint, c );

                if ( delim == '\'' && scriptAttr && scriptlets )
                    strStart = ToggleInString( pprint );

                ++value;
                continue;
            }
            else if ( c == '\'' )
            {
                if ( cfgBool(doc, TidyQuoteMarks) )
                    AddString( pprint, "&#39;" );
                else
                    AddChar( pprint, c );

                if ( delim == '"' && scriptAttr && scriptlets )
                    strStart = ToggleInString( pprint );

                ++value;
                continue;
            }

            /* look for UTF-8 multibyte character */
            if ( c > 0x7F )
                 value += TY_(GetUTF8)( value, &c );
            ++value;

            if ( c == '\n' )
            {
                /* No indent inside Javascript literals */
                TY_(PFlushLine)( doc, (strStart < 0
                                       && !cfgBool(doc, TidyLiteralAttribs) ?
                                       indent : 0) );
                continue;
            }
            PPrintChar( doc, c, mode );
        }
        ClearInAttrVal( pprint );
        ClearInString( pprint );
    }
    AddChar( pprint, delim );
}